

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O0

void __thiscall optimization::graph_color::Conflict_Map::remove_edge_less_colors(Conflict_Map *this)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  iterator this_00;
  pointer ppVar4;
  long in_RDI;
  VarId var;
  iterator __end3;
  iterator __begin3;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *__range3;
  iterator iter;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  vars_to_remove;
  uint min_edge;
  iterator min_edge_iter;
  VarId *in_stack_ffffffffffffff18;
  VarId *in_stack_ffffffffffffff20;
  _Rb_tree_const_iterator<mir::inst::VarId> in_stack_ffffffffffffff28;
  _Rb_tree_const_iterator<mir::inst::VarId> __first;
  undefined1 local_b8 [32];
  _Self local_98;
  _Self local_90;
  _Base_ptr *local_88;
  _Base_ptr local_70;
  _Base_ptr local_68;
  _Self local_60;
  _Rb_tree_node_base local_58;
  undefined1 in_stack_ffffffffffffffe7;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar5;
  
  do {
    sVar3 = std::
            map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
            ::size((map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                    *)0x1a9e9d);
    if (sVar3 == 0) {
      return;
    }
    this_00 = std::
              map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
              ::begin((map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                       *)in_stack_ffffffffffffff18);
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
                           *)0x1a9ece);
    uVar5 = ppVar4->first;
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::set
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)0x1a9ee4);
    if (uVar5 < *(uint *)(in_RDI + 0x19c)) {
      local_58._0_8_ =
           std::
           map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
           ::begin((map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                    *)in_stack_ffffffffffffff18);
      while( true ) {
        local_60._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
             ::end((map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                    *)in_stack_ffffffffffffff18);
        bVar1 = std::operator!=((_Self *)&local_58,&local_60);
        bVar2 = false;
        if (bVar1) {
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
                                 *)0x1a9f6b);
          bVar2 = ppVar4->first < *(uint *)(in_RDI + 0x19c);
        }
        if (!bVar2) break;
        __first._M_node = &local_58;
        std::
        _Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
                      *)0x1a9f9e);
        local_68 = (_Base_ptr)
                   std::
                   set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                   ::begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                            *)in_stack_ffffffffffffff18);
        std::
        _Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
                      *)0x1a9fbc);
        local_70 = (_Base_ptr)
                   std::
                   set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                   ::end((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                          *)in_stack_ffffffffffffff18);
        std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>::
        insert<std::_Rb_tree_const_iterator<mir::inst::VarId>>
                  ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    *)in_stack_ffffffffffffff20,__first,in_stack_ffffffffffffff28);
        std::
        _Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
                      *)in_stack_ffffffffffffff20);
      }
      local_88 = &local_58._M_left;
      local_90._M_node =
           (_Base_ptr)
           std::
           set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
           begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  *)in_stack_ffffffffffffff18);
      local_98._M_node =
           (_Base_ptr)
           std::
           set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
           end((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)in_stack_ffffffffffffff18);
      while (bVar2 = std::operator!=(&local_90,&local_98), bVar2) {
        std::_Rb_tree_const_iterator<mir::inst::VarId>::operator*
                  ((_Rb_tree_const_iterator<mir::inst::VarId> *)0x1aa067);
        in_stack_ffffffffffffff20 = (VarId *)(local_b8 + 0x10);
        mir::inst::VarId::VarId(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        in_stack_ffffffffffffff28._M_node = (_Base_ptr)local_b8;
        mir::inst::VarId::VarId(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        remove_node((Conflict_Map *)this_00._M_node,
                    (VarId *)CONCAT44(uVar5,in_stack_ffffffffffffffe8),
                    (bool)in_stack_ffffffffffffffe7);
        std::_Rb_tree_const_iterator<mir::inst::VarId>::operator++
                  ((_Rb_tree_const_iterator<mir::inst::VarId> *)in_stack_ffffffffffffff20);
      }
      local_58._M_parent._4_4_ = 0;
    }
    else {
      local_58._M_parent._4_4_ = 1;
    }
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::~set
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)0x1aa0c9);
  } while (local_58._M_parent._4_4_ == 0);
  return;
}

Assistant:

void remove_edge_less_colors() {
    while (true) {
      if (!edge_vars.size()) {
        return;
      }
      auto min_edge_iter = edge_vars.begin();
      auto min_edge = min_edge_iter->first;
      std::set<mir::inst::VarId> vars_to_remove;
      if (min_edge >= color_num) {
        return;
      }
      for (auto iter = edge_vars.begin();
           iter != edge_vars.end() && iter->first < color_num; ++iter) {
        vars_to_remove.insert(iter->second.begin(), iter->second.end());
      }
      for (auto var : vars_to_remove) {
        remove_node(var);
      }
    }
  }